

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

Expression *
slang::ast::StreamingConcatenationExpression::fromSyntax
          (Compilation *comp,StreamingConcatenationExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *pSVar1;
  TokenKind TVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  SourceLocation location;
  undefined4 extraout_var;
  Expression *pEVar7;
  Type *pTVar8;
  optional<int> value;
  StreamExpressionSyntax *pSVar9;
  ExpressionSyntax *pEVar10;
  ElementSelectSyntax *syntax_00;
  Type *this;
  UnpackedUnionType *pUVar11;
  ValueSymbol *pVVar12;
  ulong uVar13;
  Diagnostic *pDVar14;
  StreamingConcatenationExpression *pSVar15;
  ParentList *pPVar16;
  undefined4 uVar17;
  not_null<const_slang::ast::Type_*> *this_00;
  int unaff_R15D;
  SourceRange sourceRange;
  iterator_range<slang::ast::Scope::iterator> iVar18;
  span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
  sVar19;
  optional<slang::ConstantRange> oVar20;
  Expression *arg;
  Compilation *local_320;
  size_t local_318;
  StreamingConcatenationExpressionSyntax *local_310;
  Type *local_308;
  anon_class_24_3_37492b14 badResult;
  const_iterator __begin2;
  SmallVector<slang::ast::StreamingConcatenationExpression::StreamExpression,_4UL> buffer;
  EvalContext evalCtx;
  
  TVar2 = (syntax->operatorToken).kind;
  badResult.sliceSize = &local_318;
  local_318 = 0;
  local_320 = comp;
  local_308 = assignmentTarget;
  badResult.comp = comp;
  badResult.syntax = syntax;
  if (((context->flags).m_bits & 0x200) == 0) {
    location = parsing::Token::location(&syntax->operatorToken);
    ASTContext::addDiag(context,(DiagCode)0x290007,location);
LAB_00322557:
    pEVar7 = fromSyntax::anon_class_24_3_37492b14::operator()(&badResult);
    return pEVar7;
  }
  local_310 = syntax;
  if (syntax->sliceSize == (ExpressionSyntax *)0x0) {
    if (TVar2 == LeftShift) {
      local_318 = 1;
    }
  }
  else {
    iVar5 = Expression::bind((int)syntax->sliceSize,(sockaddr *)context,4);
    pEVar7 = (Expression *)CONCAT44(extraout_var,iVar5);
    bVar4 = Expression::bad(pEVar7);
    if (bVar4) goto LAB_00322557;
    if (pEVar7->kind == DataType) {
      this_00 = &pEVar7->type;
      pTVar8 = not_null<const_slang::ast::Type_*>::get(this_00);
      bVar4 = Type::isFixedSize(pTVar8);
      if (!bVar4) {
        pDVar14 = ASTContext::addDiag(context,(DiagCode)0x2c0007,pEVar7->sourceRange);
        pTVar8 = not_null<const_slang::ast::Type_*>::get(this_00);
        if (((ulong)(pTVar8->super_Symbol).location & 0xfffffff) != 0) {
          pTVar8 = not_null<const_slang::ast::Type_*>::get(this_00);
          Diagnostic::addNote(pDVar14,(DiagCode)0x40001,(pTVar8->super_Symbol).location);
        }
        goto LAB_00322557;
      }
      pTVar8 = not_null<const_slang::ast::Type_*>::get(this_00);
      local_318 = Type::bitstreamWidth(pTVar8);
    }
    else {
      value = ASTContext::evalInteger(context,pEVar7);
      bVar4 = ASTContext::requireGtZero(context,value,pEVar7->sourceRange);
      if (!bVar4) goto LAB_00322557;
      local_318 = (size_t)value.super__Optional_base<int,_true,_true>._M_payload.
                          super__Optional_payload_base<int>._M_payload;
    }
    if (TVar2 != LeftShift) {
      local_318 = 0;
      sourceRange = slang::syntax::SyntaxNode::sourceRange(&local_310->sliceSize->super_SyntaxNode);
      ASTContext::addDiag(context,(DiagCode)0x980007,sourceRange);
    }
  }
  buffer.super_SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>.data_
       = (pointer)buffer.
                  super_SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>
                  .firstElement;
  buffer.super_SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>.len =
       0;
  buffer.super_SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>.cap =
       4;
  pSVar1 = &local_310->expressions;
  __begin2.index = 0;
  __begin2.list = pSVar1;
  sVar3 = (local_310->expressions).elements.size_;
  uVar13 = 0;
  pPVar16 = pSVar1;
  do {
    if ((pPVar16 == pSVar1) && (uVar13 == sVar3 + 1 >> 1)) {
      pTVar8 = local_320->voidType;
      sVar19 = SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
               ccopy(&buffer.
                      super_SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>
                     ,&local_320->super_BumpAllocator);
      evalCtx.compilation = (Compilation *)sVar19.data_;
      evalCtx._8_4_ = sVar19.size_._0_4_;
      evalCtx.steps = sVar19.size_._4_4_;
      __begin2 = (const_iterator)slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_310);
      pSVar15 = BumpAllocator::
                emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,nonstd::span_lite::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                          (&local_320->super_BumpAllocator,pTVar8,&local_318,
                           (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                            *)&evalCtx,(SourceRange *)&__begin2);
      goto LAB_00322a87;
    }
    pSVar9 = slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::
             iterator_base<const_slang::syntax::StreamExpressionSyntax_*>::operator*(&__begin2);
    if (local_308 == (Type *)0x0) {
LAB_003226cf:
      pEVar10 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pSVar9->expression);
      arg = Expression::selfDetermined
                      (local_320,pEVar10,context,(bitmask<slang::ast::ASTFlags>)0x200);
    }
    else {
      pEVar10 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pSVar9->expression);
      if ((pEVar10->super_SyntaxNode).kind != StreamingConcatenationExpression) goto LAB_003226cf;
      pEVar10 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pSVar9->expression);
      arg = Expression::create(local_320,pEVar10,context,(bitmask<slang::ast::ASTFlags>)0x200,
                               local_308);
    }
    bVar4 = Expression::bad(arg);
    if (bVar4) {
      pSVar15 = (StreamingConcatenationExpression *)
                fromSyntax::anon_class_24_3_37492b14::operator()(&badResult);
      goto LAB_00322a87;
    }
    if (pSVar9->withRange != (StreamExpressionWithRangeSyntax *)0x0) {
      pTVar8 = not_null<const_slang::ast::Type_*>::get(&arg->type);
      bVar4 = Type::isUnpackedArray(pTVar8);
      if ((!bVar4) || (bVar4 = Type::isAssociativeArray(pTVar8), bVar4)) {
LAB_00322961:
        ASTContext::addDiag(context,(DiagCode)0x300007,arg->sourceRange);
      }
      else {
        pTVar8 = Type::getArrayElementType(pTVar8);
        bVar4 = Type::isFixedSize(pTVar8);
        pEVar7 = arg;
        if (!bVar4) goto LAB_00322961;
        syntax_00 = not_null<slang::syntax::ElementSelectSyntax_*>::get(&pSVar9->withRange->range);
        ASTContext::resetFlags
                  ((ASTContext *)&evalCtx,context,(bitmask<slang::ast::ASTFlags>)0x800000000);
        pEVar7 = Expression::bindSelector(local_320,pEVar7,syntax_00,(ASTContext *)&evalCtx);
        bVar4 = Expression::bad(pEVar7);
        if (!bVar4) {
          evalCtx.compilation = local_320;
          evalCtx._8_4_ = evalCtx._8_4_ & 0xffffff00;
          evalCtx.steps = 0;
          evalCtx.disableTarget._0_4_ = 0;
          evalCtx.disableTarget._4_4_ = 0;
          evalCtx.queueTarget._0_4_ = 0;
          evalCtx.queueTarget._4_4_ = 0;
          evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
               (pointer)evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                        firstElement;
          evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
          evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
          evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
               (pointer)evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
          evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
          evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
          evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.data_ =
               (pointer)evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                        super_SmallVectorBase<slang::Diagnostic>.firstElement;
          evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.len = 0;
          evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.cap = 2;
          evalCtx.disableRange.startLoc = (SourceLocation)0x0;
          evalCtx.disableRange.endLoc = (SourceLocation)0x0;
          oVar20 = Expression::evalSelector(pEVar7,&evalCtx);
          if (((undefined1  [12])
               oVar20.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) ==
              (undefined1  [12])0x0) {
            uVar17 = 0;
          }
          else {
            iVar6 = oVar20.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_payload._0_4_ -
                    oVar20.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_payload._4_4_;
            iVar5 = -iVar6;
            if (0 < iVar6) {
              iVar5 = iVar6;
            }
            unaff_R15D = iVar5 + 1;
            uVar17 = 1;
          }
          EvalContext::~EvalContext(&evalCtx);
          goto LAB_00322888;
        }
      }
      pSVar15 = (StreamingConcatenationExpression *)
                fromSyntax::anon_class_24_3_37492b14::operator()(&badResult);
      goto LAB_00322a87;
    }
    uVar17 = 0;
    pEVar7 = (Expression *)0x0;
LAB_00322888:
    pEVar10 = not_null<slang::syntax::ExpressionSyntax_*>::get(&pSVar9->expression);
    if ((pEVar10->super_SyntaxNode).kind != StreamingConcatenationExpression) {
      pTVar8 = not_null<const_slang::ast::Type_*>::get(&arg->type);
      bVar4 = Type::isUnpackedUnion(pTVar8);
      if ((bVar4) && (bVar4 = Type::isTaggedUnion(pTVar8), !bVar4)) {
        this = Type::getCanonicalType(pTVar8);
        pUVar11 = Symbol::as<slang::ast::UnpackedUnionType>(&this->super_Symbol);
        iVar18 = Scope::members(&pUVar11->super_Scope);
        if (iVar18.m_begin.current.current != iVar18.m_end.current.current) {
          pVVar12 = Symbol::as<slang::ast::ValueSymbol>(iVar18.m_begin.current.current);
          pTVar8 = DeclaredType::getType(&pVVar12->declaredType);
        }
      }
      bVar4 = Type::isBitstreamType(pTVar8,local_308 == (Type *)0x0);
      if (!bVar4) {
        pDVar14 = ASTContext::addDiag(context,(DiagCode)0x2a0007,arg->sourceRange);
        pTVar8 = not_null<const_slang::ast::Type_*>::get(&arg->type);
        ast::operator<<(pDVar14,pTVar8);
        pSVar15 = (StreamingConcatenationExpression *)
                  fromSyntax::anon_class_24_3_37492b14::operator()(&badResult);
LAB_00322a87:
        SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
        ~SmallVectorBase(&buffer.
                          super_SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>
                        );
        return &pSVar15->super_Expression;
      }
    }
    not_null<slang::ast::Expression_const*>::not_null<slang::ast::Expression*&,void>
              ((not_null<slang::ast::Expression_const*> *)&evalCtx,&arg);
    evalCtx._8_4_ = SUB84(pEVar7,0);
    evalCtx.steps = (uint32_t)((ulong)pEVar7 >> 0x20);
    evalCtx.disableTarget._0_4_ = unaff_R15D;
    evalCtx.disableTarget._4_4_ = uVar17;
    SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
    emplace_back<slang::ast::StreamingConcatenationExpression::StreamExpression>
              (&buffer.
                super_SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>
               ,(StreamExpression *)&evalCtx);
    uVar13 = __begin2.index + 1;
    __begin2.index = uVar13;
    pPVar16 = __begin2.list;
  } while( true );
}

Assistant:

Expression& StreamingConcatenationExpression::fromSyntax(
    Compilation& comp, const StreamingConcatenationExpressionSyntax& syntax,
    const ASTContext& context, const Type* assignmentTarget) {

    // The sole purpose of assignmentTarget here is to know whether this is a
    // "destination" stream (i.e. an unpack operation) or whether it is a source / pack.
    // Streaming concatenation is self-determined and its size/type should not be affected
    // by assignmentTarget.
    const bool isDestination = !assignmentTarget;

    const bool isRightToLeft = syntax.operatorToken.kind == TokenKind::LeftShift;
    size_t sliceSize = 0;

    auto badResult = [&]() -> Expression& {
        return badExpr(comp, comp.emplace<StreamingConcatenationExpression>(
                                 comp.getErrorType(), sliceSize, span<const StreamExpression>(),
                                 syntax.sourceRange()));
    };

    if (!context.flags.has(ASTFlags::StreamingAllowed)) {
        context.addDiag(diag::BadStreamContext, syntax.operatorToken.location());
        return badResult();
    }

    if (syntax.sliceSize) {
        // The slice_size determines the size of each block. If specified, it may be a constant
        // integral expression or a simple type.
        auto& sliceExpr = bind(*syntax.sliceSize, context, ASTFlags::AllowDataType);
        if (sliceExpr.bad())
            return badResult();

        if (sliceExpr.kind == ExpressionKind::DataType) {
            if (!sliceExpr.type->isFixedSize()) {
                auto& diag = context.addDiag(diag::BadStreamSlice, sliceExpr.sourceRange);
                if (sliceExpr.type->location)
                    diag.addNote(diag::NoteDeclarationHere, sliceExpr.type->location);
                return badResult();
            }
            sliceSize = sliceExpr.type->bitstreamWidth();
        }
        else {
            // It shall be an error for the value to be zero or negative.
            std::optional<int32_t> count = context.evalInteger(sliceExpr);
            if (!context.requireGtZero(count, sliceExpr.sourceRange))
                return badResult();
            sliceSize = static_cast<size_t>(*count);
        }

        if (!isRightToLeft) {
            // Left-to-right streaming using >> shall cause the slice_size to be ignored and no
            // re-ordering performed.
            sliceSize = 0;
            context.addDiag(diag::IgnoredSlice, syntax.sliceSize->sourceRange());
        }
    }
    else if (isRightToLeft) {
        // If a slice_size is not specified, the default is 1.
        sliceSize = 1;
    }

    SmallVector<StreamExpression, 4> buffer;
    for (const auto argSyntax : syntax.expressions) {
        Expression* arg;
        if (assignmentTarget &&
            argSyntax->expression->kind == SyntaxKind::StreamingConcatenationExpression) {
            arg = &create(comp, *argSyntax->expression, context, ASTFlags::StreamingAllowed,
                          assignmentTarget);
        }
        else {
            arg = &selfDetermined(comp, *argSyntax->expression, context,
                                  ASTFlags::StreamingAllowed);
        }

        if (arg->bad())
            return badResult();

        const Expression* withExpr = nullptr;
        std::optional<bitwidth_t> constantWithWidth;
        if (argSyntax->withRange) {
            // The expression before the with can be any one-dimensional unpacked array
            // (including a queue). Interpreted as fixed-sized unpacked arrays,
            // dynamic arrays, or queues of fixed-size elements.
            auto& arrayType = *arg->type;
            if (!arrayType.isUnpackedArray() || arrayType.isAssociativeArray() ||
                !arrayType.getArrayElementType()->isFixedSize()) {
                context.addDiag(diag::BadStreamWithType, arg->sourceRange);
                return badResult();
            }

            withExpr = &bindSelector(comp, *arg, *argSyntax->withRange->range,
                                     context.resetFlags(ASTFlags::StreamingWithRange));
            if (withExpr->bad())
                return badResult();

            // Try to get the bounds of the selection, if they are constant.
            EvalContext evalCtx(comp);
            auto range = withExpr->evalSelector(evalCtx);
            if (range)
                constantWithWidth = range->width();
        }

        if (argSyntax->expression->kind != SyntaxKind::StreamingConcatenationExpression) {
            // Unpacked unions get "unwrapped" to their first member when streaming.
            const Type* type = arg->type;
            if (type->isUnpackedUnion() && !type->isTaggedUnion()) {
                auto& uu = type->getCanonicalType().as<UnpackedUnionType>();
                auto members = uu.members();
                if (members.begin() != members.end())
                    type = &members.begin()->as<ValueSymbol>().getType();
            }

            if (!type->isBitstreamType(isDestination)) {
                context.addDiag(diag::BadStreamExprType, arg->sourceRange) << *arg->type;
                return badResult();
            }
        }

        buffer.push_back({arg, withExpr, constantWithWidth});
    }

    // Streaming concatenation has no explicit type. Use void to prevent problems when
    // its type is passed to context-determined expressions.
    return *comp.emplace<StreamingConcatenationExpression>(comp.getVoidType(), sliceSize,
                                                           buffer.ccopy(comp),
                                                           syntax.sourceRange());
}